

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

Path * find_path(Path *__return_storage_ptr__,Grid *grid)

{
  GridNode *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  GridNode *item;
  GridNode *a;
  ostream *poVar4;
  GridNode *item_00;
  reference ppGVar5;
  NODE_STATE local_88;
  GridNode *local_70;
  GridNode *node;
  int moveCost;
  GridNode *neighbour;
  int i;
  GridNode *currentNode;
  undefined1 local_40 [4];
  int iteration;
  Heap closedList;
  Heap openList;
  GridNode *targetNode;
  GridNode *startNode;
  Grid *grid_local;
  
  item = Grid::get_start_node(grid);
  a = Grid::get_target_node(grid);
  Heap::Heap((Heap *)&closedList.count,0xe1);
  Heap::Heap((Heap *)local_40,0xe1);
  Heap::add_to_heap((Heap *)&closedList.count,item);
  currentNode._4_4_ = 0;
  while (0 < (int)openList.list) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Iteration: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,currentNode._4_4_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    currentNode._4_4_ = currentNode._4_4_ + 1;
    item_00 = Heap::remove_first((Heap *)&closedList.count);
    Heap::add_to_heap((Heap *)local_40,item_00);
    poVar4 = std::operator<<((ostream *)&std::cout,"Current Node:");
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(item_00->pos).x);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(item_00->pos).y);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if (item_00 == a) break;
    for (neighbour._4_4_ = 0; neighbour._4_4_ < item_00->neighbourCount;
        neighbour._4_4_ = neighbour._4_4_ + 1) {
      ppGVar5 = std::vector<GridNode_*,_std::allocator<GridNode_*>_>::operator[]
                          (&item_00->neighbours,(long)neighbour._4_4_);
      this = *ppGVar5;
      bVar1 = GridNode::is_traversable(this);
      if ((bVar1) && (bVar1 = Heap::has_node((Heap *)local_40,this), !bVar1)) {
        iVar3 = item_00->gCost;
        iVar2 = get_distance_bw_nodes(item_00,this);
        iVar3 = iVar3 + iVar2;
        bVar1 = Heap::has_node((Heap *)&closedList.count,this);
        if ((!bVar1) || (iVar3 < this->gCost)) {
          this->gCost = iVar3;
          iVar3 = get_distance_bw_nodes(a,this);
          this->hCost = iVar3;
          this->parent = item_00;
          bVar1 = Heap::has_node((Heap *)&closedList.count,this);
          if (bVar1) {
            Heap::update_item((Heap *)&closedList.count,this);
          }
          else {
            if (this == a) {
              local_88 = this->state;
            }
            else {
              local_88 = NEIGHBOUR;
            }
            this->state = local_88;
            Heap::add_to_heap((Heap *)&closedList.count,this);
          }
        }
      }
    }
    if (item_00 != item) {
      item_00->state = CHECKED;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Path Found!!!");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Path::Path(__return_storage_ptr__);
  local_70 = a->parent;
  while (local_70 != item) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Path Node:");
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(local_70->pos).x);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(local_70->pos).y);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    NodeList::add_node(&__return_storage_ptr__->grids,local_70);
    local_70 = local_70->parent;
    __return_storage_ptr__->number = __return_storage_ptr__->number + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Path find_path(Grid *grid)
{
    // Setup nodes
    GridNode *startNode = grid->get_start_node();
    GridNode *targetNode = grid->get_target_node();

    // Calculate Path

#if USE_HEAPS
    Heap openList;
    Heap closedList;
    openList.add_to_heap(startNode);
#else
    NodeList openList;
    NodeList closedList;
    openList.add_node(startNode);
#endif
    int iteration = 0;
    while (openList.count > 0)
    {
        std::cout << "Iteration: " << iteration << std::endl;
        iteration++;
// Find Current Node
#if USE_HEAPS
        GridNode *currentNode = openList.remove_first();
        closedList.add_to_heap(currentNode);
#else
        GridNode *currentNode = openList.get_current_node();
        openList.remove_node(currentNode);
        closedList.add_node(currentNode);
#endif
        std::cout << "Current Node:"
                  << "(" << currentNode->pos.x << "," << currentNode->pos.y << ")" << std::endl;
        if (currentNode == targetNode)
        {
            break;
        }
        // Check Neighbours
        for (int i = 0; i < currentNode->neighbourCount; i++)
        {
            GridNode *neighbour = currentNode->neighbours[i];
            if (neighbour->is_traversable() && !closedList.has_node(neighbour))
            {
                int moveCost = currentNode->gCost + get_distance_bw_nodes(currentNode, neighbour);
                if (!openList.has_node(neighbour) || moveCost < neighbour->gCost)
                {
                    neighbour->gCost = moveCost;
                    neighbour->hCost = get_distance_bw_nodes(targetNode, neighbour);
                    neighbour->parent = currentNode;
                    if (!openList.has_node(neighbour))
                    {
                        neighbour->state = (neighbour != targetNode) ? NEIGHBOUR : neighbour->state;
#if USE_HEAPS
                        openList.add_to_heap(neighbour);
#else
                        openList.add_node(neighbour);
#endif
                    }
                    else
                    {
#if USE_HEAPS
                        openList.update_item(neighbour);
#else
                        set_cost(neighbour, startNode, targetNode);
#endif
                    }
                }
            }
        }
        if (currentNode != startNode)
        {
            currentNode->state = CHECKED;
        }
    }
    std::cout << "Path Found!!!" << std::endl;

    // Setup Path
    Path p;
    GridNode *node = targetNode->parent;
    while (node != startNode)
    {
        std::cout << "Path Node:"
                  << "(" << node->pos.x << "," << node->pos.y << ")" << std::endl;
        p.grids.add_node(node);
        node = node->parent;
        p.number++;
    }
    return p;
}